

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# median.h
# Opt level: O1

uint pseudo_median<unsigned_int>(uint *begin,uint *end)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  
  lVar8 = (long)end - (long)begin;
  if ((ulong)(lVar8 >> 2) < 4) {
    __assert_fail("N>3",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/median.h"
                  ,0x41,"CharT pseudo_median(CharT *, CharT *) [CharT = unsigned int]");
  }
  uVar4 = *begin;
  uVar1 = begin[1];
  uVar7 = uVar4;
  if ((uVar4 != uVar1) && (uVar3 = begin[2], uVar7 = uVar3, uVar3 != uVar1 && uVar3 != uVar4)) {
    uVar7 = uVar1;
    if (uVar4 < uVar1) {
      if ((uVar3 <= uVar1) && (uVar7 = uVar3, uVar3 < uVar4)) {
        uVar7 = uVar4;
      }
    }
    else if ((uVar1 <= uVar3) && (uVar7 = uVar3, uVar4 < uVar3)) {
      uVar7 = uVar4;
    }
  }
  uVar6 = lVar8 >> 2 & 0xfffffffffffffffe;
  uVar4 = *(uint *)((long)begin + uVar6 * 2);
  uVar1 = *(uint *)((long)begin + uVar6 * 2 + 4);
  uVar3 = uVar4;
  if ((uVar4 != uVar1) &&
     (uVar5 = *(uint *)((long)begin + uVar6 * 2 + 8), uVar3 = uVar5,
     uVar5 != uVar1 && uVar5 != uVar4)) {
    uVar3 = uVar1;
    if (uVar4 < uVar1) {
      if ((uVar5 <= uVar1) && (uVar3 = uVar5, uVar5 < uVar4)) {
        uVar3 = uVar4;
      }
    }
    else if ((uVar1 <= uVar5) && (uVar3 = uVar5, uVar4 < uVar5)) {
      uVar3 = uVar4;
    }
  }
  uVar4 = *(uint *)((long)begin + lVar8 + -0xc);
  uVar1 = *(uint *)((long)begin + lVar8 + -8);
  uVar5 = uVar4;
  if ((uVar4 != uVar1) &&
     (uVar2 = *(uint *)((long)begin + lVar8 + -4), uVar5 = uVar2, uVar2 != uVar1 && uVar2 != uVar4))
  {
    uVar5 = uVar1;
    if (uVar4 < uVar1) {
      if ((uVar2 <= uVar1) && (uVar5 = uVar2, uVar2 < uVar4)) {
        uVar5 = uVar4;
      }
    }
    else if ((uVar1 <= uVar2) && (uVar5 = uVar2, uVar4 < uVar2)) {
      uVar5 = uVar4;
    }
  }
  if (uVar7 != uVar3) {
    uVar4 = uVar5;
    if ((uVar5 != uVar7) && (uVar5 != uVar3)) {
      uVar4 = uVar3;
      if (uVar7 < uVar3) {
        if (uVar5 <= uVar3) {
          if (uVar5 < uVar7) {
            uVar5 = uVar7;
          }
          return uVar5;
        }
      }
      else if ((uVar3 <= uVar5) && (uVar4 = uVar5, uVar7 < uVar5)) {
        uVar4 = uVar7;
      }
    }
    return uVar4;
  }
  return uVar7;
}

Assistant:

inline CharT
pseudo_median(CharT* begin, CharT* end)
{
	size_t N=end-begin;
	assert(N>3);
	return med3char(
			med3char(begin[0],   begin[1],     begin[2]),
			med3char(begin[N/2], begin[N/2+1], begin[N/2+2]),
			med3char(begin[N-3], begin[N-2],   begin[N-1])
		       );
}